

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeInstruction
          (AsmWriteWLADX *this,Pointer pc,int numBits,int numBytesUsed,string *param,
          string *line_comment,CombinationBool accumulator_wide,CombinationBool index_wide,
          Combination8 data_bank,Combination16 direct_page,bool is_predicted)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  Options *pOVar10;
  undefined8 uVar11;
  FILE *pFVar12;
  char *pcVar13;
  FILE **ppFVar14;
  ulong uVar15;
  
  prepareWrite(this,pc,true);
  pbVar9 = snestistics::RomAccessor::evalPtr(this->m_romData,pc);
  if (this->m_options->asm_print_pc == true) {
    iVar3 = fprintf((FILE *)this->m_outFile,"    ");
LAB_0012965a:
    uVar11 = 0x20;
    if (is_predicted) {
      uVar11 = 0x70;
    }
    bVar2 = false;
    iVar4 = fprintf((FILE *)this->m_outFile,"/*%c",uVar11);
    iVar3 = iVar3 + iVar4;
  }
  else {
    bVar1 = this->m_options->asm_print_bytes;
    iVar3 = fprintf((FILE *)this->m_outFile,"    ");
    bVar2 = true;
    if ((bVar1 & 1U) != 0) goto LAB_0012965a;
  }
  ppFVar14 = &this->m_outFile;
  pOVar10 = this->m_options;
  if (pOVar10->asm_print_register_sizes == true) {
    if (((uint3)accumulator_wide & 0x10000) == 0) {
      pFVar12 = (FILE *)*ppFVar14;
      iVar4 = 0x3f;
    }
    else if (((uint3)accumulator_wide & 0x100) == 0) {
      pFVar12 = (FILE *)*ppFVar14;
      iVar4 = 0x2a;
    }
    else {
      pFVar12 = (FILE *)*ppFVar14;
      if (((uint3)accumulator_wide & 1) == 0) {
        iVar4 = 0x6d;
      }
      else {
        iVar4 = 0x4d;
      }
    }
    fputc(iVar4,pFVar12);
    if (((uint3)index_wide & 0x10000) == 0) {
      pFVar12 = (FILE *)*ppFVar14;
      iVar4 = 0x3f;
    }
    else if (((uint3)index_wide & 0x100) == 0) {
      pFVar12 = (FILE *)*ppFVar14;
      iVar4 = 0x2a;
    }
    else {
      pFVar12 = (FILE *)*ppFVar14;
      if (((uint3)index_wide & 1) == 0) {
        iVar4 = 0x69;
      }
      else {
        iVar4 = 0x49;
      }
    }
    fputc(iVar4,pFVar12);
    fputc(0x20,(FILE *)this->m_outFile);
    iVar3 = iVar3 + 3;
    pOVar10 = this->m_options;
  }
  if (pOVar10->asm_print_db == true) {
    if (((uint3)data_bank & 0x10000) == 0) {
      __assert_fail("data_bank.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x179,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint3)data_bank & 0x100) == 0) {
      iVar4 = fprintf((FILE *)*ppFVar14,"   ");
    }
    else {
      iVar4 = fprintf((FILE *)*ppFVar14,"%02X ",(ulong)((uint3)data_bank & 0xff));
    }
    iVar3 = iVar3 + iVar4;
  }
  if (this->m_options->asm_print_dp == true) {
    if (((uint)direct_page >> 0x18 & 1) == 0) {
      __assert_fail("direct_page.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x182,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint)direct_page >> 0x10 & 1) == 0) {
      iVar4 = fprintf((FILE *)*ppFVar14,"     ");
    }
    else {
      iVar4 = fprintf((FILE *)*ppFVar14,"%04X ",(ulong)((uint)direct_page & 0xffff));
    }
    iVar3 = iVar3 + iVar4;
  }
  pOVar10 = this->m_options;
  if (pOVar10->asm_print_pc == true) {
    iVar4 = fprintf((FILE *)this->m_outFile,"%06X ",pc);
    iVar3 = iVar3 + iVar4;
    pOVar10 = this->m_options;
  }
  if (pOVar10->asm_print_bytes == true) {
    if (0 < numBytesUsed) {
      uVar15 = 0;
      do {
        iVar4 = fprintf((FILE *)*ppFVar14,"%02X ",(ulong)pbVar9[uVar15]);
        iVar3 = iVar3 + iVar4;
        uVar15 = uVar15 + 1;
      } while ((uint)numBytesUsed != uVar15);
      if (3 < numBytesUsed) goto LAB_001298ac;
    }
    iVar4 = numBytesUsed + -4;
    do {
      iVar5 = fprintf((FILE *)*ppFVar14,"   ");
      iVar3 = iVar3 + iVar5;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
LAB_001298ac:
  if (!bVar2) {
    iVar4 = fprintf((FILE *)*ppFVar14,"*/ ");
    iVar3 = iVar3 + iVar4;
  }
  pcVar13 = *(char **)(snestistics::opCodeInfo + (ulong)*pbVar9 * 0x18 + 8);
  pFVar12 = (FILE *)this->m_outFile;
  if (this->m_options->asm_lower_case_op == true) {
    uVar6 = tolower((int)*pcVar13);
    uVar7 = tolower((int)pcVar13[1]);
    uVar8 = tolower((int)pcVar13[2]);
    iVar4 = fprintf(pFVar12,"%c%c%c",(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
  }
  else {
    iVar4 = fprintf(pFVar12,"%s",pcVar13);
  }
  iVar4 = iVar4 + iVar3;
  iVar3 = strcmp(*(char **)(snestistics::opCodeInfo + (ulong)*pbVar9 * 0x18 + 8),"BRL");
  if ((numBits != 0) && (iVar3 != 0)) {
    if (numBits == 8) {
      pcVar13 = ".b";
    }
    else if (numBits == 0x18) {
      pcVar13 = ".l";
    }
    else {
      if (numBits != 0x10) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x1ab,
                      "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                     );
      }
      pcVar13 = ".w";
    }
    iVar3 = fprintf((FILE *)*ppFVar14,pcVar13);
    iVar4 = iVar4 + iVar3;
  }
  if (param->_M_string_length != 0) {
    iVar3 = fprintf((FILE *)*ppFVar14," %s",(param->_M_dataplus)._M_p);
    iVar4 = iVar4 + iVar3;
  }
  iVar3 = 0x48;
  if (0x48 < iVar4) {
    iVar3 = iVar4;
  }
  writeCommentHelper(this,iVar4,(iVar3 - 0x45U & 0xfffffffc) + 0x48,line_comment);
  this->m_nextPC = numBytesUsed + pc;
  return;
}

Assistant:

void writeInstruction(const Pointer pc, const int numBits, const int numBytesUsed, const std::string &param, const std::string &line_comment, CombinationBool accumulator_wide, CombinationBool index_wide, Combination8 data_bank, Combination16 direct_page, bool is_predicted) {
		prepareWrite(pc);
		const uint8_t* data = m_romData.evalPtr(pc);

		bool overrideInstructionWithDB = false;

		if (numBytesUsed == 2 && data[0] == 0xF0 && data[1] == 0x80) {
			// WLA DX has a bug here, emit using .DB instad
			overrideInstructionWithDB = true;
		}

		// Keep track of bytes written so we can align comment column
		int nw = 0;

		const bool emitCommentPC = m_options.asm_print_pc || m_options.asm_print_bytes || overrideInstructionWithDB;

		nw += fprintf(m_outFile, "    ");
		if (emitCommentPC) {
			nw += fprintf(m_outFile, "/*%c", is_predicted ? 'p':' ');
		}

		if (m_options.asm_print_register_sizes) {
			if(!accumulator_wide.has_value) {
				fputc('?', m_outFile);
			} else if (accumulator_wide.single_value) {
				if (accumulator_wide.value) {
					fputc('M', m_outFile);
				} else {
					fputc('m', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			if(!index_wide.has_value) {
				fputc('?', m_outFile);
			} else if (index_wide.single_value) {
				if (index_wide.value) {
					fputc('I', m_outFile);
				} else {
					fputc('i', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			fputc(' ', m_outFile);
			nw += 3;
		}

		if (m_options.asm_print_db) {
			assert(data_bank.has_value);
			if (data_bank.single_value) {
				nw += fprintf(m_outFile, "%02X ", data_bank.value);
			} else {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (m_options.asm_print_dp) {
			assert(direct_page.has_value);
			if (direct_page.single_value) {
				nw += fprintf(m_outFile, "%04X ", direct_page.value);
			} else {
				nw += fprintf(m_outFile, "     ");
			}
		}

		if (m_options.asm_print_pc) {
			nw += fprintf(m_outFile, "%06X ", pc);
		}
		if (m_options.asm_print_bytes) {
			for (int k = 0; k < numBytesUsed; k++) {
				nw += fprintf(m_outFile, "%02X ", data[k]);
			}
			for (int k = numBytesUsed; k < 4; k++) {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (emitCommentPC && !overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		const char * const op = opCodeInfo[data[0]].mnemonics;
		if (m_options.asm_lower_case_op) {
			nw += fprintf(m_outFile, "%c%c%c", tolower(op[0]), tolower(op[1]), tolower(op[2]));
		} else {
			nw += fprintf(m_outFile, "%s", op);
		}

		if (strcmp(opCodeInfo[data[0]].mnemonics, "BRL") == 0) {

		} else if (numBits == 0) {
		} else if (numBits == 8) {
			nw += fprintf(m_outFile, ".b");
		} else if (numBits == 16) {
			nw += fprintf(m_outFile, ".w");
		} else if (numBits == 24) {
			nw += fprintf(m_outFile, ".l");
		} else {
			assert(false);
		}

		if (!param.empty()) {
			nw += fprintf(m_outFile, " %s", param.c_str());
		}

		if (overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		writeCommentHelper(nw, adjusted_column(nw), line_comment);

		if (overrideInstructionWithDB) {
			fprintf(m_outFile, ".DB ");
			for (int k = 0; k < numBytesUsed; k++) {
				fprintf(m_outFile, "$%02X%s", data[k], k != numBytesUsed-1 ? ", ":"");
			}
			fprintf(m_outFile, "\n");
		}

		m_nextPC = pc + numBytesUsed;
	}